

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::resize_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          ssize_t sw,ssize_t sh)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  invalid_argument *this_00;
  ssize_t xx;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  uint64_t sa22;
  uint64_t sb22;
  uint64_t sg22;
  uint64_t sr22;
  uint64_t sa21;
  uint64_t sb21;
  uint64_t sg21;
  uint64_t sr21;
  uint64_t sa12;
  uint64_t sb12;
  uint64_t sg12;
  uint64_t sr12;
  uint64_t sa11;
  uint64_t sb11;
  uint64_t sg11;
  uint64_t sr11;
  uint64_t local_130 [16];
  double local_b0;
  double local_a8;
  double local_a0;
  long local_98;
  ssize_t local_90;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  Image *local_68;
  ssize_t local_60;
  long local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_98 = y;
  local_68 = this;
  local_60 = x;
  if ((0 < w) && (0 < h)) {
    if (sw < 0) {
      sw = source->width;
    }
    if (sh < 0) {
      sh = source->height;
    }
    local_a0 = (double)(h + -1);
    local_a8 = (double)(sh + -1);
    local_b0 = (double)sy;
    local_70 = (double)(w + -1);
    local_78 = (double)(sw + -1);
    local_80 = (double)sx;
    local_88 = 0;
    local_90 = h;
    do {
      dVar16 = ((double)local_88 / local_a0) * local_a8;
      dVar7 = dVar16 + local_b0;
      uVar1 = (ulong)dVar7;
      uVar1 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      dVar16 = dVar16 - ((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      local_50 = 1.0 - dVar16;
      local_58 = local_98 + local_88;
      lVar6 = 0;
      do {
        dVar8 = ((double)lVar6 / local_70) * local_78;
        dVar7 = dVar8 + local_80;
        uVar2 = (ulong)dVar7;
        uVar2 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
        local_130[0xf] = 0;
        local_130[0xe] = 0;
        local_130[0xd] = 0;
        local_130[0xc] = 0;
        local_130[0xb] = 0;
        local_130[10] = 0;
        local_130[9] = 0;
        local_130[8] = 0;
        local_130[7] = 0;
        local_130[6] = 0;
        local_130[5] = 0;
        local_130[4] = 0;
        local_130[3] = 0;
        local_130[2] = 0;
        local_130[1] = 0;
        local_130[0] = 0;
        read_pixel(source,uVar2,uVar1,local_130 + 0xf,local_130 + 0xe,local_130 + 0xd,
                   local_130 + 0xc);
        auVar12._8_4_ = (int)(uVar2 >> 0x20);
        auVar12._0_8_ = uVar2;
        auVar12._12_4_ = 0x45300000;
        dVar7 = (double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0;
        dVar14 = auVar12._8_8_ - 1.9342813113834067e+25;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          local_48 = dVar7;
          dStack_40 = dVar14;
          read_pixel(source,uVar2,uVar1 + 1,local_130 + 0xb,local_130 + 10,local_130 + 9,
                     local_130 + 8);
          dVar7 = local_48;
          dVar14 = dStack_40;
        }
        dVar8 = dVar8 - (dVar14 + dVar7);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          read_pixel(source,uVar2 + 1,uVar1,local_130 + 7,local_130 + 6,local_130 + 5,local_130 + 4)
          ;
        }
        if (((dVar16 != 0.0) || (NAN(dVar16))) && ((dVar8 != 0.0 || (NAN(dVar8))))) {
          read_pixel(source,uVar2 + 1,uVar1 + 1,local_130 + 3,local_130 + 2,local_130 + 1,local_130)
          ;
        }
        auVar13._8_4_ = (int)(local_130[0xf] >> 0x20);
        auVar13._0_8_ = local_130[0xf];
        auVar13._12_4_ = 0x45300000;
        dVar14 = local_50 * (1.0 - dVar8);
        dVar7 = (1.0 - dVar8) * dVar16;
        dVar15 = local_50 * dVar8;
        dVar8 = dVar8 * dVar16;
        dVar19 = (((double)CONCAT44(0x45300000,(int)(local_130[3] >> 0x20)) - 1.9342813113834067e+25
                  ) + ((double)CONCAT44(0x43300000,(int)local_130[3]) - 4503599627370496.0)) * dVar8
                 + (((double)CONCAT44(0x45300000,(int)(local_130[7] >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[7]) - 4503599627370496.0)) * dVar15 +
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[0xf]) - 4503599627370496.0)) * dVar14
                   + (((double)CONCAT44(0x45300000,(int)(local_130[0xb] >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_130[0xb]) - 4503599627370496.0)) *
                     dVar7;
        uVar2 = (ulong)dVar19;
        dVar17 = (((double)CONCAT44(0x45300000,(int)(local_130[2] >> 0x20)) - 1.9342813113834067e+25
                  ) + ((double)CONCAT44(0x43300000,(int)local_130[2]) - 4503599627370496.0)) * dVar8
                 + (((double)CONCAT44(0x45300000,(int)(local_130[6] >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[6]) - 4503599627370496.0)) * dVar15 +
                   (((double)CONCAT44(0x45300000,(int)(local_130[0xe] >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[0xe]) - 4503599627370496.0)) * dVar14
                   + (((double)CONCAT44(0x45300000,(int)(local_130[10] >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_130[10]) - 4503599627370496.0)) * dVar7
        ;
        uVar3 = (ulong)dVar17;
        dVar18 = (((double)CONCAT44(0x45300000,(int)(local_130[1] >> 0x20)) - 1.9342813113834067e+25
                  ) + ((double)CONCAT44(0x43300000,(int)local_130[1]) - 4503599627370496.0)) * dVar8
                 + (((double)CONCAT44(0x45300000,(int)(local_130[5] >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[5]) - 4503599627370496.0)) * dVar15 +
                   (((double)CONCAT44(0x45300000,(int)(local_130[0xd] >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_130[0xd]) - 4503599627370496.0)) * dVar14
                   + (((double)CONCAT44(0x45300000,(int)(local_130[9] >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_130[9]) - 4503599627370496.0)) * dVar7;
        uVar4 = (ulong)dVar18;
        auVar10._8_4_ = (int)(local_130[4] >> 0x20);
        auVar10._0_8_ = local_130[4];
        auVar10._12_4_ = 0x45300000;
        auVar11._8_4_ = (int)(local_130[0] >> 0x20);
        auVar11._0_8_ = local_130[0];
        auVar11._12_4_ = 0x45300000;
        dVar7 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_130[0]) - 4503599627370496.0)) * dVar8 +
                ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_130[4]) - 4503599627370496.0)) * dVar15 +
                (((double)CONCAT44(0x45300000,(int)(local_130[0xc] >> 0x20)) -
                 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_130[0xc]) - 4503599627370496.0)) * dVar14 +
                (((double)CONCAT44(0x45300000,(int)(local_130[8] >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)local_130[8]) - 4503599627370496.0)) * dVar7;
        uVar5 = (ulong)dVar7;
        write_pixel(local_68,local_60 + lVar6,local_58,
                    (long)(dVar19 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2,
                    (long)(dVar17 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,
                    (long)(dVar18 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,
                    (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
        lVar6 = lVar6 + 1;
      } while (w != lVar6);
      local_88 = local_88 + 1;
    } while (local_88 != local_90);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this_00,"source width/height must be specified");
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void Image::resize_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, ssize_t sw, ssize_t sh) {
  if (w <= 0 || h <= 0) {
    throw invalid_argument("source width/height must be specified");
  }
  if (sw < 0) {
    sw = source.get_width();
  }
  if (sh < 0) {
    sh = source.get_height();
  }

  for (ssize_t yy = 0; yy < h; yy++) {
    double y_rel_dist = static_cast<double>(yy) / (h - 1);
    double source_y_progress = y_rel_dist * (sh - 1);
    size_t source_y1 = sy + source_y_progress;
    size_t source_y2 = source_y1 + 1;
    double source_y2_factor = source_y_progress - source_y1;
    double source_y1_factor = 1.0 - source_y2_factor;

    for (ssize_t xx = 0; xx < w; xx++) {
      double x_rel_dist = static_cast<double>(xx) / (w - 1);
      double source_x_progress = x_rel_dist * (sw - 1);
      size_t source_x1 = sx + source_x_progress;
      size_t source_x2 = source_x1 + 1;
      double source_x2_factor = source_x_progress - source_x1;
      double source_x1_factor = 1.0 - source_x2_factor;

      uint64_t sr11 = 0, sg11 = 0, sb11 = 0, sa11 = 0;
      uint64_t sr12 = 0, sg12 = 0, sb12 = 0, sa12 = 0;
      uint64_t sr21 = 0, sg21 = 0, sb21 = 0, sa21 = 0;
      uint64_t sr22 = 0, sg22 = 0, sb22 = 0, sa22 = 0;
      source.read_pixel(source_x1, source_y1, &sr11, &sg11, &sb11, &sa11);
      if (source_y2_factor != 0.0) {
        source.read_pixel(source_x1, source_y2, &sr12, &sg12, &sb12, &sa12);
      }
      if (source_x2_factor != 0.0) {
        source.read_pixel(source_x2, source_y1, &sr21, &sg21, &sb21, &sa21);
      }
      if (source_x2_factor != 0.0 && source_y2_factor != 0.0) {
        source.read_pixel(source_x2, source_y2, &sr22, &sg22, &sb22, &sa22);
      }

      uint64_t dr = sr11 * (source_x1_factor * source_y1_factor) +
          sr12 * (source_x1_factor * source_y2_factor) +
          sr21 * (source_x2_factor * source_y1_factor) +
          sr22 * (source_x2_factor * source_y2_factor);
      uint64_t dg = sg11 * (source_x1_factor * source_y1_factor) +
          sg12 * (source_x1_factor * source_y2_factor) +
          sg21 * (source_x2_factor * source_y1_factor) +
          sg22 * (source_x2_factor * source_y2_factor);
      uint64_t db = sb11 * (source_x1_factor * source_y1_factor) +
          sb12 * (source_x1_factor * source_y2_factor) +
          sb21 * (source_x2_factor * source_y1_factor) +
          sb22 * (source_x2_factor * source_y2_factor);
      uint64_t da = sa11 * (source_x1_factor * source_y1_factor) +
          sa12 * (source_x1_factor * source_y2_factor) +
          sa21 * (source_x2_factor * source_y1_factor) +
          sa22 * (source_x2_factor * source_y2_factor);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}